

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

unsigned_long_long __thiscall
ImGui::RoundScalarWithFormatT<unsigned_long_long,long_long>
          (ImGui *this,char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *pcVar1;
  ImGui IVar2;
  ImGui *pIVar3;
  ImGui *pIVar4;
  int iVar5;
  undefined4 in_register_00000014;
  uint uVar6;
  char *src;
  double dVar7;
  char fmt_sanitized [32];
  char v_str [64];
  unsigned_long_long local_80;
  ImGui local_78 [31];
  char local_59;
  char local_58 [72];
  
  local_80 = CONCAT44(in_register_00000014,data_type);
  do {
    IVar2 = *this;
    if (IVar2 == (ImGui)0x0) {
      iVar5 = 3;
      pIVar4 = (ImGui *)v;
    }
    else if ((IVar2 != (ImGui)0x25) || (iVar5 = 1, pIVar4 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar2 == (ImGui)0x25) + 1;
      iVar5 = 0;
      pIVar4 = (ImGui *)v;
    }
    v = (unsigned_long_long)pIVar4;
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    this = pIVar4;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    pIVar3 = (ImGui *)ImParseFormatFindEnd((char *)this);
    pIVar4 = local_78;
    if (this < pIVar3) {
      do {
        uVar6 = (byte)*this - 0x24;
        if ((0x3b < uVar6) || ((0x800000000000009U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
          *pIVar4 = *this;
          pIVar4 = pIVar4 + 1;
        }
        this = this + 1;
      } while (this != pIVar3);
    }
    *pIVar4 = (ImGui)0x0;
    ImFormatString(local_58,0x40,(char *)local_78,local_80);
    src = &local_59;
    do {
      pcVar1 = src + 1;
      src = src + 1;
    } while (*pcVar1 == ' ');
    if (((uint)format & 0xfffffffe) == 8) {
      dVar7 = atof(src);
      local_80 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    }
    else {
      ImAtoi<long_long>(src,(longlong *)&local_80);
    }
  }
  return local_80;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}